

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2ImplicitConversions(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_a18;
  RE2 local_898;
  StringPiece local_7b8;
  LogMessage local_7a8;
  RE2 local_628;
  StringPiece local_548;
  LogMessage local_538;
  RE2 local_3b8;
  StringPiece local_2d8;
  LogMessage local_2c8;
  RE2 local_148;
  StringPiece local_68;
  char *local_58;
  char *re_cstring;
  StringPiece re_stringpiece;
  allocator local_29;
  string local_28 [8];
  string re_string;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,".",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  StringPiece::StringPiece((StringPiece *)&re_cstring,".");
  local_58 = ".";
  StringPiece::StringPiece(&local_68,"e");
  RE2::RE2(&local_148,(string *)local_28);
  bVar1 = RE2::PartialMatch<>(&local_68,&local_148);
  RE2::~RE2(&local_148);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4d8);
    poVar2 = LogMessage::stream(&local_2c8);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(\"e\", re_string)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2c8);
  }
  StringPiece::StringPiece(&local_2d8,"e");
  RE2::RE2(&local_3b8,(StringPiece *)&re_cstring);
  bVar1 = RE2::PartialMatch<>(&local_2d8,&local_3b8);
  RE2::~RE2(&local_3b8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_538,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4d9);
    poVar2 = LogMessage::stream(&local_538);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(\"e\", re_stringpiece)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_538);
  }
  StringPiece::StringPiece(&local_548,"e");
  RE2::RE2(&local_628,local_58);
  bVar1 = RE2::PartialMatch<>(&local_548,&local_628);
  RE2::~RE2(&local_628);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4da);
    poVar2 = LogMessage::stream(&local_7a8);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(\"e\", re_cstring)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_7a8);
  }
  StringPiece::StringPiece(&local_7b8,"e");
  RE2::RE2(&local_898,".");
  bVar1 = RE2::PartialMatch<>(&local_7b8,&local_898);
  RE2::~RE2(&local_898);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a18,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4db);
    poVar2 = LogMessage::stream(&local_a18);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(\"e\", \".\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a18);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(RE2, ImplicitConversions) {
  string re_string(".");
  StringPiece re_stringpiece(".");
  const char* re_cstring = ".";
  EXPECT_TRUE(RE2::PartialMatch("e", re_string));
  EXPECT_TRUE(RE2::PartialMatch("e", re_stringpiece));
  EXPECT_TRUE(RE2::PartialMatch("e", re_cstring));
  EXPECT_TRUE(RE2::PartialMatch("e", "."));
}